

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::guess_value_type<std::vector<char,std::allocator<char>>>
          (result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  char cVar1;
  reference pcVar2;
  location<std::vector<char,_std::allocator<char>_>_> *l;
  value_t local_30;
  success_type local_2f;
  value_t local_2e;
  success_type local_2d;
  value_t local_2c;
  success_type local_2b;
  value_t local_2a;
  success_type local_29;
  value_t local_28;
  success_type local_27;
  value_t local_26;
  success_type local_25;
  value_t local_24;
  success_type local_23;
  value_t local_22;
  success_type local_21;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  detail *local_18;
  location<std::vector<char,_std::allocator<char>_>_> *loc_local;
  
  local_18 = this;
  loc_local = (location<std::vector<char,_std::allocator<char>_>_> *)__return_storage_ptr__;
  local_20._M_current =
       (char *)location<std::vector<char,_std::allocator<char>_>_>::iter
                         ((location<std::vector<char,_std::allocator<char>_>_> *)this);
  pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*(&local_20);
  cVar1 = *pcVar2;
  if (cVar1 == '\"') {
    local_22 = string;
    local_21.value = (value_type)ok<toml::value_t>(&local_22);
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_21);
  }
  else if (cVar1 == '\'') {
    local_24 = string;
    local_23.value = (value_type)ok<toml::value_t>(&local_24);
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_23);
  }
  else if (cVar1 == '[') {
    local_2a = array;
    local_29.value = (value_type)ok<toml::value_t>(&local_2a);
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_29);
  }
  else if (cVar1 == 'f') {
    local_28 = boolean;
    local_27.value = (value_type)ok<toml::value_t>(&local_28);
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_27);
  }
  else if (cVar1 == 'i') {
    local_2e = floating;
    local_2d.value = (value_type)ok<toml::value_t>(&local_2e);
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_2d);
  }
  else if (cVar1 == 'n') {
    local_30 = floating;
    local_2f.value = (value_type)ok<toml::value_t>(&local_30);
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_2f);
  }
  else if (cVar1 == 't') {
    local_26 = boolean;
    local_25.value = (value_type)ok<toml::value_t>(&local_26);
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_25);
  }
  else if (cVar1 == '{') {
    local_2c = table;
    local_2b.value = (value_type)ok<toml::value_t>(&local_2c);
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_2b);
  }
  else {
    guess_number_type<std::vector<char,std::allocator<char>>>(__return_storage_ptr__,local_18,l);
  }
  return __return_storage_ptr__;
}

Assistant:

result<value_t, std::string> guess_value_type(const location<Container>& loc)
{
    switch(*loc.iter())
    {
        case '"' : {return ok(value_t::string);  }
        case '\'': {return ok(value_t::string);  }
        case 't' : {return ok(value_t::boolean); }
        case 'f' : {return ok(value_t::boolean); }
        case '[' : {return ok(value_t::array);   }
        case '{' : {return ok(value_t::table);   }
        case 'i' : {return ok(value_t::floating);} // inf.
        case 'n' : {return ok(value_t::floating);} // nan.
        default  : {return guess_number_type(loc);}
    }
}